

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TheoryAxioms.cpp
# Opt level: O2

void __thiscall Shell::TheoryAxioms::addCommutativity(TheoryAxioms *this,Interpretation op)

{
  uint fn;
  TermList sort;
  TermList arg1;
  TermList arg2;
  initializer_list<Kernel::Literal_*> lits;
  Literal *local_38;
  
  fn = Kernel::Signature::getInterpretingSymbol(DAT_00a14190,op);
  sort = Kernel::Theory::getOperationSort(op);
  arg1._content = (uint64_t)Kernel::Term::create2(fn,(TermList)0x1,(TermList)0x5);
  arg2._content = (uint64_t)Kernel::Term::create2(fn,(TermList)0x5,(TermList)0x1);
  local_38 = Kernel::Literal::createEquality(true,arg1,arg2,sort);
  lits._M_len = 1;
  lits._M_array = &local_38;
  addTheoryClauseFromLits(this,lits,THA_COMMUTATIVITY,1);
  return;
}

Assistant:

void TheoryAxioms::addCommutativity(Interpretation op)
{
  ASS(theory->isFunction(op));
  ASS_EQ(theory->getArity(op),2);

  unsigned f = env.signature->getInterpretingSymbol(op);
  TermList srt = theory->getOperationSort(op);
  TermList x(0,false);
  TermList y(1,false);
  TermList fxy(Term::create2(f,x,y));
  TermList fyx(Term::create2(f,y,x));
  Literal* eq = Literal::createEquality(true,fxy,fyx,srt);
  addTheoryClauseFromLits({eq}, InferenceRule::THA_COMMUTATIVITY, EXPENSIVE);
}